

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tilemap.cpp
# Opt level: O3

void __thiscall imgtogb::Tilemap::Tilemap(Tilemap *this,Image *img,int offset)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 uVar5;
  size_t sVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  uint5 uVar11;
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  _Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_> _Var14;
  size_type sVar15;
  reference piVar16;
  ulong uVar17;
  uchar *puVar18;
  long lVar19;
  uchar *puVar20;
  ulong uVar21;
  long lVar22;
  uchar *puVar23;
  ulong uVar24;
  size_type i;
  ulong j;
  bool bVar25;
  int iVar26;
  int iVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>,_std::_Rb_tree_iterator<std::pair<const_int,_imgtogb::Tile>_>_>
  pVar28;
  int hash;
  int local_a4;
  Tilemap *local_a0;
  _Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
  *local_98;
  unbounded_array<int,_std::allocator<int>_> *local_90;
  ulong local_88;
  Image *local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  size_t local_60;
  long local_58;
  pair<int,_imgtogb::Tile> local_50;
  
  this->img = img;
  this->offset = offset;
  uVar2 = img->_width;
  uVar3 = img->_height;
  iVar26 = (int)(((uint)((int)uVar2 >> 0x1f) >> 0x1d) + uVar2) >> 3;
  iVar27 = (int)(((uint)((int)uVar3 >> 0x1f) >> 0x1d) + uVar3) >> 3;
  this->tiles_x = CONCAT44(-(uint)(iVar26 < 0),iVar26);
  *(int *)&this->ntiles = iVar27;
  *(uint *)((long)&this->ntiles + 4) = -(uint)(iVar27 < 0);
  this->ntiles = 0;
  local_80 = img;
  boost::numeric::ublas::
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  ::matrix(&this->tilemap,(long)iVar26,(long)iVar27);
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar17 = this->tiles_y;
  if (uVar17 != 0) {
    local_98 = (_Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
                *)&this->map;
    local_90 = &(this->tilemap).data_;
    uVar21 = this->tiles_x;
    local_78 = 0;
    j = 0;
    local_a0 = this;
    do {
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else {
        uVar4 = (uint)(local_78 >> 3) & 0x1fffffff;
        local_70 = (ulong)(uVar4 * 8);
        local_68 = (ulong)(uVar4 << 3);
        lVar19 = 0;
        i = 0;
        local_88 = j;
        do {
          uVar17 = (ulong)((uint)lVar19 & 0xfffffff8);
          sVar6 = this->ntiles;
          puVar18 = local_80->_data + local_68 * local_80->_width + uVar17 + 4;
          local_a4 = 0;
          lVar22 = 8;
          do {
            uVar4 = *(uint *)(puVar18 + -4);
            auVar7[0xc] = (char)(uVar4 >> 0x18);
            auVar7._0_12_ = ZEXT712(0);
            uVar11 = CONCAT32(auVar7._10_3_,(ushort)(byte)(uVar4 >> 0x10));
            auVar13._5_8_ = 0;
            auVar13._0_5_ = uVar11;
            uVar5 = *(undefined4 *)puVar18;
            uVar21 = (ulong)(ushort)uVar5 & 0xffffffffffff00ff;
            auVar8._8_4_ = 0;
            auVar8._0_8_ = uVar21;
            auVar8[0xc] = (char)((uint)uVar5 >> 0x18);
            auVar9[8] = (char)((uint)uVar5 >> 0x10);
            auVar9._0_8_ = uVar21;
            auVar9[9] = 0;
            auVar9._10_3_ = auVar8._10_3_;
            auVar12._5_8_ = 0;
            auVar12._0_5_ = auVar9._8_5_;
            auVar10[4] = (char)((uint)uVar5 >> 8);
            auVar10._0_4_ = (int)uVar21;
            auVar10[5] = 0;
            auVar10._6_7_ = SUB137(auVar12 << 0x40,6);
            local_a4 = (uint)(uint3)(auVar8._10_3_ >> 0x10) + (uint)(uint3)(auVar7._10_3_ >> 0x10) +
                       auVar10._4_4_ +
                       (int)CONCAT72(SUB137(auVar13 << 0x40,6),(ushort)(byte)(uVar4 >> 8)) +
                       auVar9._8_4_ + (int)uVar11 + (int)uVar21 + (uVar4 & 0xff) + local_a4;
            puVar18 = puVar18 + local_80->_width;
            lVar22 = lVar22 + -1;
          } while (lVar22 != 0);
          pVar28 = std::
                   _Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
                   ::equal_range((_Rb_tree<int,_std::pair<const_int,_imgtogb::Tile>,_std::_Select1st<std::pair<const_int,_imgtogb::Tile>_>,_std::less<int>,_std::allocator<std::pair<const_int,_imgtogb::Tile>_>_>
                                  *)local_98,&local_a4);
          _Var14 = pVar28.first._M_node;
          local_60 = sVar6;
          local_58 = lVar19;
          if (_Var14._M_node == pVar28.second._M_node._M_node) {
LAB_00143d52:
            j = local_88;
            local_50.first = local_a4;
            local_50.second.y = local_88;
            local_50.second.id = (int)local_60;
            local_50.second.x = i;
            std::
            _Rb_tree<int,std::pair<int_const,imgtogb::Tile>,std::_Select1st<std::pair<int_const,imgtogb::Tile>>,std::less<int>,std::allocator<std::pair<int_const,imgtogb::Tile>>>
            ::_M_emplace_equal<std::pair<int,imgtogb::Tile>>(local_98,&local_50);
            this = local_a0;
            sVar6 = local_a0->ntiles;
            sVar15 = (local_a0->tilemap).size1_;
            local_a0->ntiles = sVar6 + 1;
            sVar15 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                               (i,sVar15,j,(local_a0->tilemap).size2_);
            piVar16 = boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::operator[]
                                (local_90,sVar15);
            *piVar16 = (int)sVar6;
          }
          else {
            puVar18 = local_80->_data;
            uVar21 = (ulong)local_80->_width;
            lVar19 = local_70 * uVar21;
LAB_00143ced:
            j = local_88;
            this = local_a0;
            puVar20 = puVar18 + (ulong)((uint)_Var14._M_node[1]._M_left & 0x1fffffff) * uVar21 * 8 +
                                (ulong)(uint)(*(int *)&_Var14._M_node[1]._M_parent << 3);
            bVar25 = false;
            uVar24 = 0;
            puVar23 = puVar18 + lVar19 + uVar17;
            do {
              lVar22 = 0;
              do {
                if (puVar23[lVar22] != puVar20[lVar22]) {
                  if (bVar25) goto LAB_00143db6;
                  _Var14._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var14._M_node);
                  if (_Var14._M_node != pVar28.second._M_node._M_node) goto LAB_00143ced;
                  goto LAB_00143d52;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 8);
              bVar25 = 6 < uVar24;
              uVar24 = uVar24 + 1;
              puVar20 = puVar20 + uVar21;
              puVar23 = puVar23 + uVar21;
            } while (uVar24 != 8);
LAB_00143db6:
            iVar26 = *(int *)&_Var14._M_node[1]._M_right;
            sVar15 = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                               (i,(local_a0->tilemap).size1_,local_88,(local_a0->tilemap).size2_);
            piVar16 = boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::operator[]
                                (local_90,sVar15);
            *piVar16 = iVar26;
          }
          i = i + 1;
          uVar21 = this->tiles_x;
          lVar19 = local_58 + 8;
        } while (i < uVar21);
        uVar17 = this->tiles_y;
      }
      j = j + 1;
      local_78 = local_78 + 8;
    } while (j < uVar17);
  }
  return;
}

Assistant:

Tilemap::Tilemap(
		const Image &img,
		int offset
	)
	: img(&img)
	, offset(offset)
	, tiles_x(img.width() / 8)
	, tiles_y(img.height() / 8)
	, ntiles(0)
	, tilemap(tiles_x, tiles_y)
	{
		for(size_t iy = 0; iy < tiles_y; ++iy) {
			for(size_t ix = 0; ix < tiles_x; ++ix) {
				Tile tile(ix, iy, ntiles);
				int hash = tile_hash(tile, img);

				// Look for existing tiles with same hash
				mmap_range range = map.equal_range(hash);
				bool found = range.first != range.second;

				if(found) {
					found = false;
					for(mmap::iterator it = range.first; it != range.second; ++it) {
						if(compare(tile, it->second, img) == true) {
							found = true;
							tilemap(ix, iy) = it->second.id;
							break;
						}
					}
				}

				// Add new tile if not found
				if(!found) {
					map.insert(std::pair<int,Tile>(hash, tile));
					tilemap(ix, iy) = ntiles++;
				}
			}
		}
	}